

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

IRNode * __thiscall kratos::ConditionalExpr::get_child(ConditionalExpr *this,uint64_t index)

{
  Var *pVVar1;
  
  if (index == 2) {
    pVVar1 = (this->super_Expr).right;
  }
  else if (index == 1) {
    pVVar1 = (this->super_Expr).left;
  }
  else if (index == 0) {
    pVVar1 = this->condition;
  }
  else {
    pVVar1 = (Var *)0x0;
  }
  return &pVVar1->super_IRNode;
}

Assistant:

IRNode *ConditionalExpr::get_child(uint64_t index) {
    if (index == 0)
        return condition;
    else if (index == 1)
        return left;
    else if (index == 2)
        return right;
    else
        return nullptr;
}